

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [32];
  undefined4 uVar10;
  undefined4 uVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  undefined4 uVar15;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  long lVar20;
  Scene *pSVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar52 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint uVar61;
  uint uVar62;
  uint uVar63;
  undefined1 auVar60 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [64];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2760 [16];
  Scene *local_2748;
  undefined1 local_2740 [16];
  Geometry *local_2730;
  ulong local_2728;
  ulong local_2720;
  long local_2718;
  long local_2710;
  ulong local_2708;
  RTCFilterFunctionNArguments local_2700;
  undefined8 local_26d0;
  undefined8 uStack_26c8;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [16];
  undefined8 local_2690;
  undefined8 uStack_2688;
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2630 [16];
  float local_2620 [4];
  float local_2610 [4];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar16;
  undefined1 auVar42 [32];
  undefined1 auVar45 [32];
  
  pauVar27 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar49 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar78 = ZEXT3264(CONCAT428(fVar49,CONCAT424(fVar49,CONCAT420(fVar49,CONCAT416(fVar49,CONCAT412(
                                                  fVar49,CONCAT48(fVar49,CONCAT44(fVar49,fVar49)))))
                                               )));
  fVar53 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_24e0._4_4_ = fVar53;
  local_24e0._0_4_ = fVar53;
  local_24e0._8_4_ = fVar53;
  local_24e0._12_4_ = fVar53;
  local_24e0._16_4_ = fVar53;
  local_24e0._20_4_ = fVar53;
  local_24e0._24_4_ = fVar53;
  local_24e0._28_4_ = fVar53;
  auVar52 = ZEXT3264(local_24e0);
  fVar54 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_2500._4_4_ = fVar54;
  local_2500._0_4_ = fVar54;
  local_2500._8_4_ = fVar54;
  local_2500._12_4_ = fVar54;
  local_2500._16_4_ = fVar54;
  local_2500._20_4_ = fVar54;
  local_2500._24_4_ = fVar54;
  local_2500._28_4_ = fVar54;
  auVar57 = ZEXT3264(local_2500);
  fVar49 = fVar49 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar53 = fVar53 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar54 = fVar54 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_2708 = uVar25 ^ 0x20;
  iVar13 = (tray->tfar).field_0.i[k];
  auVar31 = ZEXT3264(CONCAT428(iVar13,CONCAT424(iVar13,CONCAT420(iVar13,CONCAT416(iVar13,CONCAT412(
                                                  iVar13,CONCAT48(iVar13,CONCAT44(iVar13,iVar13)))))
                                               )));
  local_2520._0_8_ = CONCAT44(fVar49,fVar49) ^ 0x8000000080000000;
  local_2520._8_4_ = -fVar49;
  local_2520._12_4_ = -fVar49;
  local_2520._16_4_ = -fVar49;
  local_2520._20_4_ = -fVar49;
  local_2520._24_4_ = -fVar49;
  local_2520._28_4_ = -fVar49;
  auVar60 = ZEXT3264(local_2520);
  local_2540._0_8_ = CONCAT44(fVar53,fVar53) ^ 0x8000000080000000;
  local_2540._8_4_ = -fVar53;
  local_2540._12_4_ = -fVar53;
  local_2540._16_4_ = -fVar53;
  local_2540._20_4_ = -fVar53;
  local_2540._24_4_ = -fVar53;
  local_2540._28_4_ = -fVar53;
  auVar65 = ZEXT3264(local_2540);
  local_2560._0_8_ = CONCAT44(fVar54,fVar54) ^ 0x8000000080000000;
  local_2560._8_4_ = -fVar54;
  local_2560._12_4_ = -fVar54;
  local_2560._16_4_ = -fVar54;
  local_2560._20_4_ = -fVar54;
  local_2560._24_4_ = -fVar54;
  local_2560._28_4_ = -fVar54;
  auVar68 = ZEXT3264(local_2560);
  iVar13 = (tray->tnear).field_0.i[k];
  local_2580._4_4_ = iVar13;
  local_2580._0_4_ = iVar13;
  local_2580._8_4_ = iVar13;
  local_2580._12_4_ = iVar13;
  local_2580._16_4_ = iVar13;
  local_2580._20_4_ = iVar13;
  local_2580._24_4_ = iVar13;
  local_2580._28_4_ = iVar13;
  auVar71 = ZEXT3264(local_2580);
  iVar13 = 1 << ((uint)k & 0x1f);
  auVar38._4_4_ = iVar13;
  auVar38._0_4_ = iVar13;
  auVar38._8_4_ = iVar13;
  auVar38._12_4_ = iVar13;
  auVar38._16_4_ = iVar13;
  auVar38._20_4_ = iVar13;
  auVar38._24_4_ = iVar13;
  auVar38._28_4_ = iVar13;
  auVar42 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar38 = vpand_avx2(auVar38,auVar42);
  local_25a0 = vpcmpeqd_avx2(auVar38,auVar42);
LAB_016c0504:
  do {
    do {
      if (pauVar27 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar18 = pauVar27 + -1;
      pauVar27 = pauVar27 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar18 + 8));
    uVar19 = *(ulong *)*pauVar27;
    while ((uVar19 & 8) == 0) {
      auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar25),auVar60._0_32_,
                                auVar78._0_32_);
      auVar39 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar24),auVar65._0_32_,
                                auVar52._0_32_);
      auVar38 = vpmaxsd_avx2(ZEXT1632(auVar32),ZEXT1632(auVar39));
      auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar26),auVar68._0_32_,
                                auVar57._0_32_);
      auVar42 = vpmaxsd_avx2(ZEXT1632(auVar32),auVar71._0_32_);
      local_24c0 = vpmaxsd_avx2(auVar38,auVar42);
      auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar19 + 0x40 + local_2708),auVar60._0_32_,
                                auVar78._0_32_);
      auVar39 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar19 + 0x40 + (uVar24 ^ 0x20)),
                                auVar65._0_32_,auVar52._0_32_);
      auVar38 = vpminsd_avx2(ZEXT1632(auVar32),ZEXT1632(auVar39));
      auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar19 + 0x40 + (uVar26 ^ 0x20)),
                                auVar68._0_32_,auVar57._0_32_);
      auVar42 = vpminsd_avx2(ZEXT1632(auVar32),auVar31._0_32_);
      auVar38 = vpminsd_avx2(auVar38,auVar42);
      auVar38 = vpcmpgtd_avx2(local_24c0,auVar38);
      iVar13 = vmovmskps_avx(auVar38);
      if (iVar13 == 0xff) goto LAB_016c0504;
      bVar12 = ~(byte)iVar13;
      uVar22 = uVar19 & 0xfffffffffffffff0;
      lVar20 = 0;
      for (uVar19 = (ulong)bVar12; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      uVar19 = *(ulong *)(uVar22 + lVar20 * 8);
      uVar14 = bVar12 - 1 & (uint)bVar12;
      uVar16 = (ulong)uVar14;
      if (uVar14 != 0) {
        uVar61 = *(uint *)(local_24c0 + lVar20 * 4);
        lVar20 = 0;
        for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
          lVar20 = lVar20 + 1;
        }
        uVar14 = uVar14 - 1 & uVar14;
        uVar17 = (ulong)uVar14;
        uVar16 = *(ulong *)(uVar22 + lVar20 * 8);
        uVar62 = *(uint *)(local_24c0 + lVar20 * 4);
        if (uVar14 == 0) {
          if (uVar61 < uVar62) {
            *(ulong *)*pauVar27 = uVar16;
            *(uint *)(*pauVar27 + 8) = uVar62;
            pauVar27 = pauVar27 + 1;
          }
          else {
            *(ulong *)*pauVar27 = uVar19;
            *(uint *)(*pauVar27 + 8) = uVar61;
            uVar19 = uVar16;
            pauVar27 = pauVar27 + 1;
          }
        }
        else {
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar19;
          auVar32 = vpunpcklqdq_avx(auVar32,ZEXT416(uVar61));
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar16;
          auVar39 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar62));
          lVar20 = 0;
          for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
            lVar20 = lVar20 + 1;
          }
          uVar14 = uVar14 - 1 & uVar14;
          uVar19 = (ulong)uVar14;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)(uVar22 + lVar20 * 8);
          auVar33 = vpunpcklqdq_avx(auVar43,ZEXT416(*(uint *)(local_24c0 + lVar20 * 4)));
          auVar43 = vpcmpgtd_avx(auVar39,auVar32);
          if (uVar14 == 0) {
            auVar46 = vpshufd_avx(auVar43,0xaa);
            auVar43 = vblendvps_avx(auVar39,auVar32,auVar46);
            auVar32 = vblendvps_avx(auVar32,auVar39,auVar46);
            auVar39 = vpcmpgtd_avx(auVar33,auVar43);
            auVar46 = vpshufd_avx(auVar39,0xaa);
            auVar39 = vblendvps_avx(auVar33,auVar43,auVar46);
            auVar43 = vblendvps_avx(auVar43,auVar33,auVar46);
            auVar33 = vpcmpgtd_avx(auVar43,auVar32);
            auVar46 = vpshufd_avx(auVar33,0xaa);
            auVar33 = vblendvps_avx(auVar43,auVar32,auVar46);
            auVar32 = vblendvps_avx(auVar32,auVar43,auVar46);
            *pauVar27 = auVar32;
            pauVar27[1] = auVar33;
            uVar19 = auVar39._0_8_;
            pauVar27 = pauVar27 + 2;
          }
          else {
            lVar20 = 0;
            for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              lVar20 = lVar20 + 1;
            }
            uVar14 = uVar14 - 1 & uVar14;
            uVar19 = (ulong)uVar14;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = *(ulong *)(uVar22 + lVar20 * 8);
            auVar46 = vpunpcklqdq_avx(auVar46,ZEXT416(*(uint *)(local_24c0 + lVar20 * 4)));
            if (uVar14 == 0) {
              auVar51 = vpshufd_avx(auVar43,0xaa);
              auVar43 = vblendvps_avx(auVar39,auVar32,auVar51);
              auVar32 = vblendvps_avx(auVar32,auVar39,auVar51);
              auVar39 = vpcmpgtd_avx(auVar46,auVar33);
              auVar51 = vpshufd_avx(auVar39,0xaa);
              auVar39 = vblendvps_avx(auVar46,auVar33,auVar51);
              auVar33 = vblendvps_avx(auVar33,auVar46,auVar51);
              auVar46 = vpcmpgtd_avx(auVar33,auVar32);
              auVar51 = vpshufd_avx(auVar46,0xaa);
              auVar46 = vblendvps_avx(auVar33,auVar32,auVar51);
              auVar32 = vblendvps_avx(auVar32,auVar33,auVar51);
              auVar33 = vpcmpgtd_avx(auVar39,auVar43);
              auVar51 = vpshufd_avx(auVar33,0xaa);
              auVar33 = vblendvps_avx(auVar39,auVar43,auVar51);
              auVar39 = vblendvps_avx(auVar43,auVar39,auVar51);
              auVar43 = vpcmpgtd_avx(auVar46,auVar39);
              auVar51 = vpshufd_avx(auVar43,0xaa);
              auVar43 = vblendvps_avx(auVar46,auVar39,auVar51);
              auVar39 = vblendvps_avx(auVar39,auVar46,auVar51);
              *pauVar27 = auVar32;
              pauVar27[1] = auVar39;
              pauVar27[2] = auVar43;
              uVar19 = auVar33._0_8_;
              pauVar27 = pauVar27 + 3;
            }
            else {
              *pauVar27 = auVar32;
              pauVar27[1] = auVar39;
              pauVar27[2] = auVar33;
              pauVar18 = pauVar27 + 3;
              pauVar27[3] = auVar46;
              do {
                lVar20 = 0;
                for (uVar16 = uVar19; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000)
                {
                  lVar20 = lVar20 + 1;
                }
                auVar33._8_8_ = 0;
                auVar33._0_8_ = *(ulong *)(uVar22 + lVar20 * 8);
                auVar32 = vpunpcklqdq_avx(auVar33,ZEXT416(*(uint *)(local_24c0 + lVar20 * 4)));
                pauVar18[1] = auVar32;
                pauVar18 = pauVar18 + 1;
                uVar19 = uVar19 - 1 & uVar19;
              } while (uVar19 != 0);
              lVar20 = 0;
              while (pauVar18 != pauVar27) {
                uVar15 = *(undefined4 *)pauVar27[1];
                uVar10 = *(undefined4 *)(pauVar27[1] + 4);
                uVar14 = *(uint *)(pauVar27[1] + 8);
                uVar11 = *(undefined4 *)(pauVar27[1] + 0xc);
                for (lVar23 = 0x10;
                    (lVar20 != lVar23 && (*(uint *)(pauVar27[-1] + lVar23 + 8) < uVar14));
                    lVar23 = lVar23 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar27 + lVar23) =
                       *(undefined1 (*) [16])(pauVar27[-1] + lVar23);
                }
                puVar1 = (undefined4 *)(*pauVar27 + lVar23);
                *puVar1 = uVar15;
                puVar1[1] = uVar10;
                puVar1[2] = uVar14;
                puVar1[3] = uVar11;
                lVar20 = lVar20 + -0x10;
                pauVar27 = pauVar27 + 1;
              }
              uVar19 = *(ulong *)*pauVar18;
              pauVar27 = pauVar18;
            }
          }
        }
      }
    }
    local_2710 = (ulong)((uint)uVar19 & 0xf) - 8;
    uVar19 = uVar19 & 0xfffffffffffffff0;
    for (local_2718 = 0; local_2718 != local_2710; local_2718 = local_2718 + 1) {
      lVar20 = local_2718 * 0x50;
      pSVar21 = context->scene;
      ppfVar3 = (pSVar21->vertices).items;
      pfVar4 = ppfVar3[*(uint *)(uVar19 + 0x30 + lVar20)];
      pfVar5 = ppfVar3[*(uint *)(uVar19 + 0x34 + lVar20)];
      pfVar6 = ppfVar3[*(uint *)(uVar19 + 0x38 + lVar20)];
      pfVar7 = ppfVar3[*(uint *)(uVar19 + 0x3c + lVar20)];
      auVar43 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar19 + lVar20)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar19 + 8 + lVar20)));
      auVar32 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar19 + lVar20)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar19 + 8 + lVar20)));
      auVar33 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar19 + 4 + lVar20)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar19 + 0xc + lVar20)));
      auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar19 + 4 + lVar20)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar19 + 0xc + lVar20)));
      auVar35 = vunpcklps_avx(auVar32,auVar39);
      auVar40 = vunpcklps_avx(auVar43,auVar33);
      auVar48 = vunpckhps_avx(auVar43,auVar33);
      auVar43 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar19 + 0x10 + lVar20)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar19 + 0x18 + lVar20)));
      auVar32 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar19 + 0x10 + lVar20)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar19 + 0x18 + lVar20)));
      auVar33 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar19 + 0x14 + lVar20)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar19 + 0x1c + lVar20)));
      auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar19 + 0x14 + lVar20)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar19 + 0x1c + lVar20)));
      auVar51 = vunpcklps_avx(auVar32,auVar39);
      auVar28 = vunpcklps_avx(auVar43,auVar33);
      auVar32 = vunpckhps_avx(auVar43,auVar33);
      auVar33 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar19 + 0x20 + lVar20)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar19 + 0x28 + lVar20)));
      auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar19 + 0x20 + lVar20)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar19 + 0x28 + lVar20)));
      auVar46 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar19 + 0x24 + lVar20)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar19 + 0x2c + lVar20)));
      auVar43 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar19 + 0x24 + lVar20)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar19 + 0x2c + lVar20)));
      auVar34 = vunpcklps_avx(auVar39,auVar43);
      auVar50 = vunpcklps_avx(auVar33,auVar46);
      auVar46 = vunpckhps_avx(auVar33,auVar46);
      puVar2 = (undefined8 *)(uVar19 + 0x30 + lVar20);
      local_2690 = *puVar2;
      uStack_2688 = puVar2[1];
      puVar2 = (undefined8 *)(uVar19 + 0x40 + lVar20);
      local_26d0 = *puVar2;
      uStack_26c8 = puVar2[1];
      auVar39 = vsubps_avx(auVar40,auVar28);
      auVar32 = vsubps_avx(auVar48,auVar32);
      auVar43 = vsubps_avx(auVar35,auVar51);
      auVar33 = vsubps_avx(auVar50,auVar40);
      auVar46 = vsubps_avx(auVar46,auVar48);
      auVar51 = vsubps_avx(auVar34,auVar35);
      auVar28._0_4_ = auVar51._0_4_ * auVar32._0_4_;
      auVar28._4_4_ = auVar51._4_4_ * auVar32._4_4_;
      auVar28._8_4_ = auVar51._8_4_ * auVar32._8_4_;
      auVar28._12_4_ = auVar51._12_4_ * auVar32._12_4_;
      local_25f0 = vfmsub231ps_fma(auVar28,auVar46,auVar43);
      auVar34._0_4_ = auVar43._0_4_ * auVar33._0_4_;
      auVar34._4_4_ = auVar43._4_4_ * auVar33._4_4_;
      auVar34._8_4_ = auVar43._8_4_ * auVar33._8_4_;
      auVar34._12_4_ = auVar43._12_4_ * auVar33._12_4_;
      local_25e0 = vfmsub231ps_fma(auVar34,auVar51,auVar39);
      uVar15 = *(undefined4 *)(ray + k * 4);
      auVar69._4_4_ = uVar15;
      auVar69._0_4_ = uVar15;
      auVar69._8_4_ = uVar15;
      auVar69._12_4_ = uVar15;
      uVar15 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar72._4_4_ = uVar15;
      auVar72._0_4_ = uVar15;
      auVar72._8_4_ = uVar15;
      auVar72._12_4_ = uVar15;
      uVar15 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar75._4_4_ = uVar15;
      auVar75._0_4_ = uVar15;
      auVar75._8_4_ = uVar15;
      auVar75._12_4_ = uVar15;
      fVar49 = *(float *)(ray + k * 4 + 0x80);
      auVar64._4_4_ = fVar49;
      auVar64._0_4_ = fVar49;
      auVar64._8_4_ = fVar49;
      auVar64._12_4_ = fVar49;
      auVar40 = vsubps_avx(auVar40,auVar69);
      fVar53 = *(float *)(ray + k * 4 + 0xa0);
      auVar70._4_4_ = fVar53;
      auVar70._0_4_ = fVar53;
      auVar70._8_4_ = fVar53;
      auVar70._12_4_ = fVar53;
      auVar48 = vsubps_avx(auVar48,auVar72);
      fVar54 = *(float *)(ray + k * 4 + 0xc0);
      auVar73._4_4_ = fVar54;
      auVar73._0_4_ = fVar54;
      auVar73._8_4_ = fVar54;
      auVar73._12_4_ = fVar54;
      auVar35 = vsubps_avx(auVar35,auVar75);
      auVar76._0_4_ = fVar49 * auVar48._0_4_;
      auVar76._4_4_ = fVar49 * auVar48._4_4_;
      auVar76._8_4_ = fVar49 * auVar48._8_4_;
      auVar76._12_4_ = fVar49 * auVar48._12_4_;
      auVar28 = vfmsub231ps_fma(auVar76,auVar40,auVar70);
      auVar66._0_4_ = auVar51._0_4_ * auVar28._0_4_;
      auVar66._4_4_ = auVar51._4_4_ * auVar28._4_4_;
      auVar66._8_4_ = auVar51._8_4_ * auVar28._8_4_;
      auVar66._12_4_ = auVar51._12_4_ * auVar28._12_4_;
      auVar77._0_4_ = auVar43._0_4_ * auVar28._0_4_;
      auVar77._4_4_ = auVar43._4_4_ * auVar28._4_4_;
      auVar77._8_4_ = auVar43._8_4_ * auVar28._8_4_;
      auVar77._12_4_ = auVar43._12_4_ * auVar28._12_4_;
      auVar58._0_4_ = fVar54 * auVar40._0_4_;
      auVar58._4_4_ = fVar54 * auVar40._4_4_;
      auVar58._8_4_ = fVar54 * auVar40._8_4_;
      auVar58._12_4_ = fVar54 * auVar40._12_4_;
      auVar51 = vfmsub231ps_fma(auVar58,auVar35,auVar64);
      auVar43 = vfmadd231ps_fma(auVar66,auVar51,auVar46);
      auVar51 = vfmadd231ps_fma(auVar77,auVar32,auVar51);
      auVar56._0_4_ = auVar46._0_4_ * auVar39._0_4_;
      auVar56._4_4_ = auVar46._4_4_ * auVar39._4_4_;
      auVar56._8_4_ = auVar46._8_4_ * auVar39._8_4_;
      auVar56._12_4_ = auVar46._12_4_ * auVar39._12_4_;
      local_25d0 = vfmsub231ps_fma(auVar56,auVar33,auVar32);
      auVar50._0_4_ = fVar53 * auVar35._0_4_;
      auVar50._4_4_ = fVar53 * auVar35._4_4_;
      auVar50._8_4_ = fVar53 * auVar35._8_4_;
      auVar50._12_4_ = fVar53 * auVar35._12_4_;
      auVar28 = vfmsub231ps_fma(auVar50,auVar48,auVar73);
      auVar74._0_4_ = local_25d0._0_4_ * fVar54;
      auVar74._4_4_ = local_25d0._4_4_ * fVar54;
      auVar74._8_4_ = local_25d0._8_4_ * fVar54;
      auVar74._12_4_ = local_25d0._12_4_ * fVar54;
      auVar32 = vfmadd231ps_fma(auVar74,local_25e0,auVar70);
      auVar46 = vfmadd231ps_fma(auVar32,local_25f0,auVar64);
      auVar59._8_4_ = 0x80000000;
      auVar59._0_8_ = 0x8000000080000000;
      auVar59._12_4_ = 0x80000000;
      auVar43 = vfmadd231ps_fma(auVar43,auVar28,auVar33);
      auVar32 = vandps_avx(auVar46,auVar59);
      uVar14 = auVar32._0_4_;
      local_2680._0_4_ = (float)(uVar14 ^ auVar43._0_4_);
      uVar61 = auVar32._4_4_;
      local_2680._4_4_ = (float)(uVar61 ^ auVar43._4_4_);
      uVar62 = auVar32._8_4_;
      local_2680._8_4_ = (float)(uVar62 ^ auVar43._8_4_);
      uVar63 = auVar32._12_4_;
      local_2680._12_4_ = (float)(uVar63 ^ auVar43._12_4_);
      auVar32 = vfmadd231ps_fma(auVar51,auVar39,auVar28);
      local_2670._0_4_ = (float)(uVar14 ^ auVar32._0_4_);
      local_2670._4_4_ = (float)(uVar61 ^ auVar32._4_4_);
      local_2670._8_4_ = (float)(uVar62 ^ auVar32._8_4_);
      local_2670._12_4_ = (float)(uVar63 ^ auVar32._12_4_);
      auVar43 = ZEXT816(0) << 0x20;
      auVar32 = vcmpps_avx(local_2680,auVar43,5);
      auVar39 = vcmpps_avx(local_2670,auVar43,5);
      auVar32 = vandps_avx(auVar39,auVar32);
      auVar51._8_4_ = 0x7fffffff;
      auVar51._0_8_ = 0x7fffffff7fffffff;
      auVar51._12_4_ = 0x7fffffff;
      local_2650 = vandps_avx(auVar46,auVar51);
      auVar39 = vcmpps_avx(auVar46,auVar43,4);
      auVar32 = vandps_avx(auVar32,auVar39);
      auVar67._0_4_ = local_2680._0_4_ + local_2670._0_4_;
      auVar67._4_4_ = local_2680._4_4_ + local_2670._4_4_;
      auVar67._8_4_ = local_2680._8_4_ + local_2670._8_4_;
      auVar67._12_4_ = local_2680._12_4_ + local_2670._12_4_;
      auVar39 = vcmpps_avx(auVar67,local_2650,2);
      auVar43 = auVar39 & auVar32;
      if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar43[0xf] < '\0'
         ) {
        auVar32 = vandps_avx(auVar32,auVar39);
        auVar47._0_4_ = local_25d0._0_4_ * auVar35._0_4_;
        auVar47._4_4_ = local_25d0._4_4_ * auVar35._4_4_;
        auVar47._8_4_ = local_25d0._8_4_ * auVar35._8_4_;
        auVar47._12_4_ = local_25d0._12_4_ * auVar35._12_4_;
        auVar39 = vfmadd213ps_fma(auVar48,local_25e0,auVar47);
        auVar39 = vfmadd213ps_fma(auVar40,local_25f0,auVar39);
        local_2660._0_4_ = (float)(uVar14 ^ auVar39._0_4_);
        local_2660._4_4_ = (float)(uVar61 ^ auVar39._4_4_);
        local_2660._8_4_ = (float)(uVar62 ^ auVar39._8_4_);
        local_2660._12_4_ = (float)(uVar63 ^ auVar39._12_4_);
        fVar49 = *(float *)(ray + k * 4 + 0x60);
        auVar40._0_4_ = local_2650._0_4_ * fVar49;
        auVar40._4_4_ = local_2650._4_4_ * fVar49;
        auVar40._8_4_ = local_2650._8_4_ * fVar49;
        auVar40._12_4_ = local_2650._12_4_ * fVar49;
        auVar39 = vcmpps_avx(auVar40,local_2660,1);
        fVar49 = *(float *)(ray + k * 4 + 0x100);
        auVar31 = ZEXT1664(CONCAT412(fVar49,CONCAT48(fVar49,CONCAT44(fVar49,fVar49))));
        auVar48._0_4_ = fVar49 * local_2650._0_4_;
        auVar48._4_4_ = fVar49 * local_2650._4_4_;
        auVar48._8_4_ = fVar49 * local_2650._8_4_;
        auVar48._12_4_ = fVar49 * local_2650._12_4_;
        auVar43 = vcmpps_avx(local_2660,auVar48,2);
        auVar39 = vandps_avx(auVar39,auVar43);
        auVar43 = auVar32 & auVar39;
        if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar43[0xf] < '\0') {
          local_2760 = vandps_avx(auVar32,auVar39);
          local_2630 = local_2760;
          auVar32 = vrcpps_avx(local_2650);
          auVar35._8_4_ = 0x3f800000;
          auVar35._0_8_ = 0x3f8000003f800000;
          auVar35._12_4_ = 0x3f800000;
          auVar39 = vfnmadd213ps_fma(local_2650,auVar32,auVar35);
          auVar32 = vfmadd132ps_fma(auVar39,auVar32,auVar32);
          fVar49 = auVar32._0_4_;
          local_2600._0_4_ = fVar49 * local_2660._0_4_;
          fVar53 = auVar32._4_4_;
          local_2600._4_4_ = fVar53 * local_2660._4_4_;
          fVar54 = auVar32._8_4_;
          local_2600._8_4_ = fVar54 * local_2660._8_4_;
          fVar55 = auVar32._12_4_;
          local_2600._12_4_ = fVar55 * local_2660._12_4_;
          auVar52 = ZEXT1664(local_2600);
          local_2620[0] = fVar49 * local_2680._0_4_;
          local_2620[1] = fVar53 * local_2680._4_4_;
          local_2620[2] = fVar54 * local_2680._8_4_;
          local_2620[3] = fVar55 * local_2680._12_4_;
          auVar36._8_4_ = 0x7f800000;
          auVar36._0_8_ = 0x7f8000007f800000;
          auVar36._12_4_ = 0x7f800000;
          auVar32 = vblendvps_avx(auVar36,local_2600,local_2760);
          local_2610[0] = fVar49 * local_2670._0_4_;
          local_2610[1] = fVar53 * local_2670._4_4_;
          local_2610[2] = fVar54 * local_2670._8_4_;
          local_2610[3] = fVar55 * local_2670._12_4_;
          auVar39 = vshufps_avx(auVar32,auVar32,0xb1);
          auVar39 = vminps_avx(auVar39,auVar32);
          auVar43 = vshufpd_avx(auVar39,auVar39,1);
          auVar39 = vminps_avx(auVar43,auVar39);
          auVar32 = vcmpps_avx(auVar32,auVar39,0);
          auVar43 = local_2760 & auVar32;
          auVar39 = vpcmpeqd_avx(auVar39,auVar39);
          if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar43[0xf] < '\0') {
            auVar39 = auVar32;
          }
          auVar32 = vandps_avx(local_2760,auVar39);
          uVar15 = vmovmskps_avx(auVar32);
          local_2728 = 0;
          for (uVar22 = CONCAT44((int)((ulong)ray >> 0x20),uVar15); local_2748 = pSVar21,
              (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
            local_2728 = local_2728 + 1;
          }
          do {
            local_2740 = auVar31._0_16_;
            uVar14 = *(uint *)((long)&local_2690 + local_2728 * 4);
            uVar22 = (ulong)uVar14;
            local_2730 = (pSVar21->geometries).items[uVar22].ptr;
            if ((local_2730->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
              *(undefined4 *)(local_2760 + local_2728 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_2730->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar49 = local_2620[local_2728];
                fVar53 = local_2610[local_2728];
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2600 + local_2728 * 4);
                *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_25f0 + local_2728 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_25e0 + local_2728 * 4);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_25d0 + local_2728 * 4);
                *(float *)(ray + k * 4 + 0x1e0) = fVar49;
                *(float *)(ray + k * 4 + 0x200) = fVar53;
                *(undefined4 *)(ray + k * 4 + 0x220) =
                     *(undefined4 *)((long)&local_26d0 + local_2728 * 4);
                *(uint *)(ray + k * 4 + 0x240) = uVar14;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                break;
              }
              local_26a0 = auVar52._0_16_;
              local_25c0 = auVar78._0_32_;
              fVar49 = local_2620[local_2728];
              local_2460._4_4_ = fVar49;
              local_2460._0_4_ = fVar49;
              local_2460._8_4_ = fVar49;
              local_2460._12_4_ = fVar49;
              local_2460._16_4_ = fVar49;
              local_2460._20_4_ = fVar49;
              local_2460._24_4_ = fVar49;
              local_2460._28_4_ = fVar49;
              local_2440 = local_2610[local_2728];
              uVar15 = *(undefined4 *)((long)&local_26d0 + local_2728 * 4);
              auVar44._4_4_ = uVar15;
              auVar44._0_4_ = uVar15;
              auVar44._8_4_ = uVar15;
              auVar44._12_4_ = uVar15;
              auVar45._16_4_ = uVar15;
              auVar45._0_16_ = auVar44;
              auVar45._20_4_ = uVar15;
              auVar45._24_4_ = uVar15;
              auVar45._28_4_ = uVar15;
              local_24c0._4_4_ = *(undefined4 *)(local_25f0 + local_2728 * 4);
              uVar15 = *(undefined4 *)(local_25e0 + local_2728 * 4);
              local_24a0._4_4_ = uVar15;
              local_24a0._0_4_ = uVar15;
              local_24a0._8_4_ = uVar15;
              local_24a0._12_4_ = uVar15;
              local_24a0._16_4_ = uVar15;
              local_24a0._20_4_ = uVar15;
              local_24a0._24_4_ = uVar15;
              local_24a0._28_4_ = uVar15;
              uVar15 = *(undefined4 *)(local_25d0 + local_2728 * 4);
              local_2480._4_4_ = uVar15;
              local_2480._0_4_ = uVar15;
              local_2480._8_4_ = uVar15;
              local_2480._12_4_ = uVar15;
              local_2480._16_4_ = uVar15;
              local_2480._20_4_ = uVar15;
              local_2480._24_4_ = uVar15;
              local_2480._28_4_ = uVar15;
              auVar41._4_4_ = uVar14;
              auVar41._0_4_ = uVar14;
              auVar41._8_4_ = uVar14;
              auVar41._12_4_ = uVar14;
              auVar42._16_4_ = uVar14;
              auVar42._0_16_ = auVar41;
              auVar42._20_4_ = uVar14;
              auVar42._24_4_ = uVar14;
              auVar42._28_4_ = uVar14;
              local_24c0._0_4_ = local_24c0._4_4_;
              local_24c0._8_4_ = local_24c0._4_4_;
              local_24c0._12_4_ = local_24c0._4_4_;
              local_24c0._16_4_ = local_24c0._4_4_;
              local_24c0._20_4_ = local_24c0._4_4_;
              local_24c0._24_4_ = local_24c0._4_4_;
              local_24c0._28_4_ = local_24c0._4_4_;
              fStack_243c = local_2440;
              fStack_2438 = local_2440;
              fStack_2434 = local_2440;
              fStack_2430 = local_2440;
              fStack_242c = local_2440;
              fStack_2428 = local_2440;
              fStack_2424 = local_2440;
              local_2420 = auVar45;
              local_2400 = auVar42;
              vpcmpeqd_avx2(local_2460,local_2460);
              uStack_23dc = context->user->instID[0];
              local_23e0 = uStack_23dc;
              uStack_23d8 = uStack_23dc;
              uStack_23d4 = uStack_23dc;
              uStack_23d0 = uStack_23dc;
              uStack_23cc = uStack_23dc;
              uStack_23c8 = uStack_23dc;
              uStack_23c4 = uStack_23dc;
              uStack_23bc = context->user->instPrimID[0];
              local_23c0 = uStack_23bc;
              uStack_23b8 = uStack_23bc;
              uStack_23b4 = uStack_23bc;
              uStack_23b0 = uStack_23bc;
              uStack_23ac = uStack_23bc;
              uStack_23a8 = uStack_23bc;
              uStack_23a4 = uStack_23bc;
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2600 + local_2728 * 4);
              local_26c0 = local_25a0;
              local_2700.valid = (int *)local_26c0;
              local_2700.geometryUserPtr = local_2730->userPtr;
              local_2700.context = context->user;
              local_2700.hit = (RTCHitN *)local_24c0;
              local_2700.N = 8;
              local_2720 = uVar25;
              local_2700.ray = (RTCRayN *)ray;
              if (local_2730->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                auVar42 = ZEXT1632(auVar41);
                auVar45 = ZEXT1632(auVar44);
                (*local_2730->intersectionFilterN)(&local_2700);
              }
              auVar30 = vpcmpeqd_avx2(local_26c0,_DAT_01f7b000);
              auVar38 = _DAT_01f7b020 & ~auVar30;
              if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar38 >> 0x7f,0) == '\0') &&
                    (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar38 >> 0xbf,0) == '\0') &&
                  (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar38[0x1f]) {
                auVar30 = auVar30 ^ _DAT_01f7b020;
              }
              else {
                p_Var8 = context->args->filter;
                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (((local_2730->field_8).field_0x2 & 0x40) != 0)))) {
                  auVar42 = ZEXT1632(auVar42._0_16_);
                  auVar45 = ZEXT1632(auVar45._0_16_);
                  (*p_Var8)(&local_2700);
                }
                auVar9 = vpcmpeqd_avx2(local_26c0,_DAT_01f7b000);
                auVar38 = vpcmpeqd_avx2(auVar45,auVar45);
                auVar30 = auVar9 ^ auVar38;
                auVar42 = vpcmpeqd_avx2(auVar42,auVar42);
                auVar38 = auVar38 & ~auVar9;
                if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar38 >> 0x7f,0) != '\0') ||
                      (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar38 >> 0xbf,0) != '\0') ||
                    (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar38[0x1f] < '\0') {
                  auVar9 = auVar9 ^ auVar42;
                  auVar38 = vmaskmovps_avx(auVar9,*(undefined1 (*) [32])local_2700.hit);
                  *(undefined1 (*) [32])(local_2700.ray + 0x180) = auVar38;
                  auVar38 = vmaskmovps_avx(auVar9,*(undefined1 (*) [32])(local_2700.hit + 0x20));
                  *(undefined1 (*) [32])(local_2700.ray + 0x1a0) = auVar38;
                  auVar38 = vmaskmovps_avx(auVar9,*(undefined1 (*) [32])(local_2700.hit + 0x40));
                  *(undefined1 (*) [32])(local_2700.ray + 0x1c0) = auVar38;
                  auVar38 = vmaskmovps_avx(auVar9,*(undefined1 (*) [32])(local_2700.hit + 0x60));
                  *(undefined1 (*) [32])(local_2700.ray + 0x1e0) = auVar38;
                  auVar38 = vmaskmovps_avx(auVar9,*(undefined1 (*) [32])(local_2700.hit + 0x80));
                  *(undefined1 (*) [32])(local_2700.ray + 0x200) = auVar38;
                  auVar38 = vpmaskmovd_avx2(auVar9,*(undefined1 (*) [32])(local_2700.hit + 0xa0));
                  *(undefined1 (*) [32])(local_2700.ray + 0x220) = auVar38;
                  auVar38 = vpmaskmovd_avx2(auVar9,*(undefined1 (*) [32])(local_2700.hit + 0xc0));
                  *(undefined1 (*) [32])(local_2700.ray + 0x240) = auVar38;
                  auVar38 = vpmaskmovd_avx2(auVar9,*(undefined1 (*) [32])(local_2700.hit + 0xe0));
                  *(undefined1 (*) [32])(local_2700.ray + 0x260) = auVar38;
                  auVar38 = vpmaskmovd_avx2(auVar9,*(undefined1 (*) [32])(local_2700.hit + 0x100));
                  *(undefined1 (*) [32])(local_2700.ray + 0x280) = auVar38;
                }
              }
              if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar30 >> 0x7f,0) == '\0') &&
                    (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar30 >> 0xbf,0) == '\0') &&
                  (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar30[0x1f]) {
                *(undefined4 *)(ray + k * 4 + 0x100) = local_2740._0_4_;
              }
              else {
                local_2740 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
              }
              *(undefined4 *)(local_2760 + local_2728 * 4) = 0;
              auVar31 = ZEXT1664(local_2740);
              uVar15 = local_2740._0_4_;
              auVar29._4_4_ = uVar15;
              auVar29._0_4_ = uVar15;
              auVar29._8_4_ = uVar15;
              auVar29._12_4_ = uVar15;
              auVar52 = ZEXT1664(local_26a0);
              auVar32 = vcmpps_avx(local_26a0,auVar29,2);
              local_2760 = vandps_avx(auVar32,local_2760);
              auVar78 = ZEXT3264(local_25c0);
              uVar22 = local_2728;
              pSVar21 = local_2748;
              uVar25 = local_2720;
            }
            if ((((local_2760 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_2760 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_2760 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_2760[0xf]) break;
            auVar37._8_4_ = 0x7f800000;
            auVar37._0_8_ = 0x7f8000007f800000;
            auVar37._12_4_ = 0x7f800000;
            auVar32 = vblendvps_avx(auVar37,auVar52._0_16_,local_2760);
            auVar39 = vshufps_avx(auVar32,auVar32,0xb1);
            auVar39 = vminps_avx(auVar39,auVar32);
            auVar43 = vshufpd_avx(auVar39,auVar39,1);
            auVar39 = vminps_avx(auVar43,auVar39);
            auVar39 = vcmpps_avx(auVar32,auVar39,0);
            auVar43 = local_2760 & auVar39;
            auVar32 = local_2760;
            if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar43[0xf] < '\0') {
              auVar32 = vandps_avx(auVar39,local_2760);
            }
            uVar15 = vmovmskps_avx(auVar32);
            local_2728 = 0;
            for (uVar22 = CONCAT44((int)(uVar22 >> 0x20),uVar15); (uVar22 & 1) == 0;
                uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              local_2728 = local_2728 + 1;
            }
          } while( true );
        }
      }
      auVar52 = ZEXT3264(local_24e0);
      auVar57 = ZEXT3264(local_2500);
      auVar60 = ZEXT3264(local_2520);
      auVar65 = ZEXT3264(local_2540);
      auVar68 = ZEXT3264(local_2560);
      auVar71 = ZEXT3264(local_2580);
    }
    uVar15 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar31 = ZEXT3264(CONCAT428(uVar15,CONCAT424(uVar15,CONCAT420(uVar15,CONCAT416(uVar15,CONCAT412
                                                  (uVar15,CONCAT48(uVar15,CONCAT44(uVar15,uVar15))))
                                                  ))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }